

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O2

edgeTy __thiscall Apt::GetPosEdgeType(Apt *this,positionTy *_pos,size_t *_pIdxE)

{
  edgeTy eVar1;
  const_reference pvVar2;
  long lVar3;
  positionTy *ppVar4;
  size_t __n;
  positionTy *ppVar5;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  positionTy basePos;
  
  __n = _pos->edgeIdx;
  if (_pos->edgeIdx == 0xffffffffffffffff) {
    ppVar4 = _pos;
    ppVar5 = &basePos;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      ppVar5->_lat = ppVar4->_lat;
      ppVar4 = (positionTy *)&ppVar4->_lon;
      ppVar5 = (positionTy *)&ppVar5->_lon;
    }
    local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FindClosestEdge(this,_pos,&basePos,(double)dataRefs.fdSnapTaxiDist,30.0,80.0,
                    (vecIdxTy *)&local_78);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
    __n = basePos.edgeIdx;
  }
  if (_pIdxE != (size_t *)0x0) {
    *_pIdxE = __n;
  }
  eVar1 = UNKNOWN_WAY;
  if (__n != 0xfffffffffffffffe) {
    pvVar2 = std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>::at(&this->vecTaxiEdges,__n);
    eVar1 = pvVar2->type;
  }
  return eVar1;
}

Assistant:

TaxiEdge::edgeTy GetPosEdgeType (const positionTy& _pos, size_t* _pIdxE = nullptr) const
    {
        // Haven't yet analysed this position?
        size_t idxE = _pos.edgeIdx;
        if (idxE == EDGE_UNKNOWN) {
            // Find the closest edge and update idxE
            positionTy basePos = _pos;
            FindClosestEdge(_pos, basePos,
                            dataRefs.GetFdSnapTaxiDist_m(),
                            ART_EDGE_ANGLE_TOLERANCE,
                            ART_EDGE_ANGLE_TOLERANCE_EXT);
            idxE = basePos.edgeIdx;
        }
        
        // return the edge's index if requested
        if (_pIdxE) *_pIdxE = idxE;
        
        // position is analyzed, but no edge found?
        if (idxE == EDGE_UNAVAIL)
            return TaxiEdge::UNKNOWN_WAY;
        
        // return the edge's type
        return vecTaxiEdges.at(idxE).GetType();
    }